

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point.cc
# Opt level: O0

Point __thiscall Point::traverse(Point *this,Point *traversal)

{
  uint row;
  uint32_t uVar1;
  Point *traversal_local;
  Point *this_local;
  
  if (traversal->row == 0) {
    row = this->row;
    uVar1 = checked_add(this->column,traversal->column);
    Point((Point *)&this_local,row,uVar1);
  }
  else {
    uVar1 = checked_add(this->row,traversal->row);
    Point((Point *)&this_local,uVar1,traversal->column);
  }
  return (Point)this_local;
}

Assistant:

Point Point::traverse (const Point &traversal) const {
    if (traversal.row == 0) {
        return Point(row, checked_add(column, traversal.column));
    } else {
        return Point(checked_add(row, traversal.row), traversal.column);
    }
}